

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_edison.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  char *__ptr;
  size_t sStack_30;
  
  iVar1 = mraa_get_platform_type(CONCAT44(in_register_0000003c,argc));
  if (iVar1 == 2) {
    iVar1 = 0;
    lVar4 = mraa_gpio_init(0);
    if (lVar4 != 0) {
      mraa_gpio_dir(lVar4,0);
      mraa_gpio_owner(lVar4,0);
      uVar2 = mraa_gpio_read(lVar4);
      uVar3 = mraa_gpio_get_pin(lVar4);
      printf("GPIO%d (mraa pin %d) was: %d, will set to %d\n",0xb6,(ulong)uVar3,(ulong)uVar2,
             (ulong)(uVar2 == 0));
      mraa_gpio_write(lVar4,(ulong)(uVar2 == 0));
      mraa_gpio_close(lVar4);
      goto LAB_00101264;
    }
    __ptr = "Error: Failed to open gpio182\n";
    sStack_30 = 0x1e;
  }
  else {
    __ptr = "Error: This program can only run on an edison\n";
    sStack_30 = 0x2e;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  iVar1 = 10;
LAB_00101264:
  mraa_deinit();
  return iVar1;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_result_t ret = MRAA_SUCCESS;
    mraa_platform_t platform_type = mraa_get_platform_type();

    if (platform_type != MRAA_INTEL_EDISON_FAB_C) {
        fprintf(stderr, "Error: This program can only run on an edison\n");
        ret = MRAA_ERROR_INVALID_PLATFORM;
        goto end;
    }

    // MRAA_INTEL_EDISON_GP182 == 0 so this will initialise pin0 on arduino
    // which is hardware gpio 130 and not 182
    mraa_gpio_context gpio182 = mraa_gpio_init(MRAA_INTEL_EDISON_GP182);
    if (gpio182 == NULL) {
        fprintf(stderr, "Error: Failed to open gpio182\n");
        ret = MRAA_ERROR_INVALID_PLATFORM;
        goto end;
    }
    mraa_gpio_dir(gpio182, MRAA_GPIO_OUT);

    // we set the owner to false here, this makes sure that we do not close the
    // gpio from sysfs in mraa_gpio_close meaning it will stay as an output and
    // we will not always transition from 0->1 as gpio182 as output has the
    // default position of '0'. Note that the value could change as a result of
    // a mraa_gpio_dir however meaning we always go from 0->1 or 1->0
    mraa_gpio_owner(gpio182, false);
    int val = mraa_gpio_read(gpio182);
    printf("GPIO%d (mraa pin %d) was: %d, will set to %d\n", 182, mraa_gpio_get_pin(gpio182), val, !val);
    mraa_gpio_write(gpio182, !val);
    mraa_gpio_close(gpio182);

end:
    mraa_deinit();
    return ret;
}